

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

void stbtt_GetBakedQuad(stbtt_bakedchar *chardata,int pw,int ph,int char_index,float *xpos,
                       float *ypos,stbtt_aligned_quad *q,int opengl_fillrule)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  if (opengl_fillrule == 0) {
    fVar5 = -0.5;
  }
  else {
    fVar5 = 0.0;
  }
  fVar6 = floorf(*xpos + chardata[char_index].xoff + 0.5);
  fVar7 = floorf(*ypos + chardata[char_index].yoff + 0.5);
  q->x0 = (float)(int)fVar6 + fVar5;
  q->y0 = (float)(int)fVar7 + fVar5;
  uVar1 = chardata[char_index].x1;
  uVar2 = chardata[char_index].x0;
  q->x1 = (float)(int)(((int)fVar6 + (uint)uVar1) - (uint)uVar2) + fVar5;
  uVar3 = chardata[char_index].y1;
  uVar4 = chardata[char_index].y0;
  q->y1 = (float)(int)(((int)fVar7 + (uint)uVar3) - (uint)uVar4) + fVar5;
  q->s0 = (float)uVar2 * (1.0 / (float)pw);
  q->t0 = (float)uVar4 * (1.0 / (float)ph);
  q->s1 = (float)uVar1 * (1.0 / (float)pw);
  q->t1 = (float)uVar3 * (1.0 / (float)ph);
  *xpos = chardata[char_index].xadvance + *xpos;
  return;
}

Assistant:

STBTT_DEF void stbtt_GetBakedQuad(stbtt_bakedchar *chardata, int pw, int ph, int char_index, float *xpos, float *ypos, stbtt_aligned_quad *q, int opengl_fillrule)
{
   float d3d_bias = opengl_fillrule ? 0 : -0.5f;
   float ipw = 1.0f / pw, iph = 1.0f / ph;
   stbtt_bakedchar *b = chardata + char_index;
   int round_x = STBTT_ifloor((*xpos + b->xoff) + 0.5f);
   int round_y = STBTT_ifloor((*ypos + b->yoff) + 0.5f);

   q->x0 = round_x + d3d_bias;
   q->y0 = round_y + d3d_bias;
   q->x1 = round_x + b->x1 - b->x0 + d3d_bias;
   q->y1 = round_y + b->y1 - b->y0 + d3d_bias;

   q->s0 = b->x0 * ipw;
   q->t0 = b->y0 * iph;
   q->s1 = b->x1 * ipw;
   q->t1 = b->y1 * iph;

   *xpos += b->xadvance;
}